

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallVector.h
# Opt level: O3

void __thiscall
llvm::SmallVector<$8cbd7509$>::SmallVector
          (SmallVector<_8cbd7509_> *this,SmallVector<_8cbd7509_> *RHS)

{
  U *pUVar1;
  
  pUVar1 = &(this->super_SmallVectorImpl<_7648aab9_>).super_SmallVectorTemplateBase<_5635df56_>.
            super_SmallVectorTemplateCommon<_b117901_>.FirstEl;
  (this->super_SmallVectorImpl<_7648aab9_>).super_SmallVectorTemplateBase<_5635df56_>.
  super_SmallVectorTemplateCommon<_b117901_>.super_SmallVectorBase.BeginX = pUVar1;
  (this->super_SmallVectorImpl<_7648aab9_>).super_SmallVectorTemplateBase<_5635df56_>.
  super_SmallVectorTemplateCommon<_b117901_>.super_SmallVectorBase.EndX = pUVar1;
  (this->super_SmallVectorImpl<_7648aab9_>).super_SmallVectorTemplateBase<_5635df56_>.
  super_SmallVectorTemplateCommon<_b117901_>.super_SmallVectorBase.CapacityX = this + 1;
  if ((RHS->super_SmallVectorImpl<_7648aab9_>).super_SmallVectorTemplateBase<_5635df56_>.
      super_SmallVectorTemplateCommon<_b117901_>.super_SmallVectorBase.BeginX !=
      (RHS->super_SmallVectorImpl<_7648aab9_>).super_SmallVectorTemplateBase<_5635df56_>.
      super_SmallVectorTemplateCommon<_b117901_>.super_SmallVectorBase.EndX) {
    SmallVectorImpl<$7648aab9$>::operator=
              (&this->super_SmallVectorImpl<_7648aab9_>,&RHS->super_SmallVectorImpl<_7648aab9_>);
  }
  return;
}

Assistant:

SmallVector(const SmallVector &RHS) : SmallVectorImpl<T>(N) {
    if (!RHS.empty())
      SmallVectorImpl<T>::operator=(RHS);
  }